

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_rtext.c
# Opt level: O0

void rtext_senditup(_rtext *x,int action,int *widthp,int *heightp,int *indexp)

{
  _glist *p_Var1;
  char **ppcVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  t_symbol *ptVar7;
  char *pcVar8;
  int *piVar9;
  undefined4 uVar11;
  undefined8 uVar10;
  int local_160;
  int local_15c;
  int tmargin;
  int lmargin;
  char *tags [3];
  int newindex;
  int newheight;
  int newwidth;
  int widthwas;
  int selend_b;
  int selstart_b;
  _glist *canvas;
  int fontheight;
  int fontwidth;
  int guifontsize;
  int outchars_b;
  char *tempbuf;
  char smallbuf [200];
  int *indexp_local;
  int *heightp_local;
  int *widthp_local;
  int action_local;
  _rtext *x_local;
  
  fontwidth = 0;
  _selend_b = glist_getcanvas(x->x_glist);
  text_getfont(x->x_text,x->x_glist,(int *)((long)&canvas + 4),(int *)&canvas,&fontheight);
  if (x->x_bufsize < 100) {
    _guifontsize = &tempbuf;
  }
  else {
    _guifontsize = (char **)getbytes((long)(x->x_bufsize * 2 + 1));
  }
  *(undefined1 *)_guifontsize = 0;
  if ((x->x_text->field_0x2e & 3) == 3) {
    piVar9 = &widthwas;
    rtext_formatatom(x,widthp,heightp,indexp,(char *)_guifontsize,&fontwidth,piVar9,&newwidth,
                     canvas._4_4_,(int)canvas);
    uVar11 = (undefined4)((ulong)piVar9 >> 0x20);
  }
  else {
    piVar9 = &widthwas;
    rtext_formattext(x,widthp,heightp,indexp,(char *)_guifontsize,&fontwidth,piVar9,&newwidth,
                     canvas._4_4_,(int)canvas);
    uVar11 = (undefined4)((ulong)piVar9 >> 0x20);
  }
  *(undefined1 *)((long)_guifontsize + (long)fontwidth) = 0;
  if (((action != 0) && (x->x_text->te_width != 0)) && ((x->x_text->field_0x2e & 3) != 3)) {
    newheight = (int)x->x_text->te_width;
    newindex = 0;
    tags[2]._4_4_ = 0;
    tags[2]._0_4_ = 0;
    x->x_text->te_width = 0;
    rtext_senditup(x,0,&newindex,(int *)((long)tags + 0x14),(int *)(tags + 2));
    if (newindex != *widthp) {
      x->x_text->te_width = (short)newheight;
    }
  }
  widthp_local._4_4_ = action;
  if ((action != 0) && ((*(ushort *)&_selend_b->field_0xe8 & 1) == 0)) {
    widthp_local._4_4_ = 0;
  }
  if (widthp_local._4_4_ == 1) {
    _tmargin = x->x_tag;
    ptVar7 = rtext_gettype(x);
    tags[0] = ptVar7->s_name;
    tags[1] = "text";
    local_15c = 2;
    local_160 = 3;
    iVar3 = glist_getzoom(x->x_glist);
    if (1 < iVar3) {
      local_15c = glist_getzoom(x->x_glist);
      local_15c = local_15c * 2;
      local_160 = glist_getzoom(x->x_glist);
      local_160 = local_160 * 3;
    }
    p_Var1 = _selend_b;
    iVar3 = text_xpix(x->x_text,x->x_glist);
    iVar4 = text_ypix(x->x_text,x->x_glist);
    ppcVar2 = _guifontsize;
    iVar5 = glist_isselected(x->x_glist,&x->x_text->te_g);
    pcVar8 = "black";
    if (iVar5 != 0) {
      pcVar8 = "blue";
    }
    pdgui_vmess("pdtk_text_new","c S ii s i r",p_Var1,3,&tmargin,(ulong)(uint)(iVar3 + local_15c),
                CONCAT44(uVar11,iVar4 + local_160),ppcVar2,fontheight,pcVar8);
  }
  else if (widthp_local._4_4_ == 2) {
    pdgui_vmess("pdtk_text_set","cs s",_selend_b,x->x_tag,_guifontsize);
    if ((*widthp != x->x_drawnwidth) || (*heightp != x->x_drawnheight)) {
      text_drawborder(x->x_text,x->x_glist,x->x_tag,*widthp,*heightp,0);
    }
    p_Var1 = _selend_b;
    if (x->x_active != 0) {
      if (widthwas < newwidth) {
        iVar3 = u8_charnum(x->x_buf,widthwas);
        uVar10 = CONCAT44(uVar11,iVar3);
        pdgui_vmess((char *)0x0,"crr si",p_Var1,"select","from",x->x_tag,uVar10);
        p_Var1 = _selend_b;
        uVar11 = (undefined4)((ulong)uVar10 >> 0x20);
        iVar3 = u8_charnum(x->x_buf,newwidth);
        pdgui_vmess((char *)0x0,"crr si",p_Var1,"select","to",x->x_tag,CONCAT44(uVar11,iVar3 + -1));
        pdgui_vmess((char *)0x0,"crs",_selend_b,"focus","");
      }
      else {
        pdgui_vmess((char *)0x0,"crr",_selend_b,"select","clear");
        p_Var1 = _selend_b;
        uVar6 = u8_charnum(x->x_buf,widthwas);
        pdgui_vmess((char *)0x0,"cr si",p_Var1,"icursor",x->x_tag,(ulong)uVar6);
        pdgui_vmess("focus","c",_selend_b);
        pdgui_vmess((char *)0x0,"crs",_selend_b,"focus",x->x_tag);
      }
    }
  }
  x->x_drawnwidth = *widthp;
  x->x_drawnheight = *heightp;
  if (_guifontsize != &tempbuf) {
    freebytes(_guifontsize,(long)(x->x_bufsize * 2 + 1));
  }
  return;
}

Assistant:

static void rtext_senditup(t_rtext *x, int action, int *widthp, int *heightp,
    int *indexp)
{
    char smallbuf[200], *tempbuf;
    int outchars_b = 0, guifontsize, fontwidth, fontheight;
    t_canvas *canvas = glist_getcanvas(x->x_glist);
    int selstart_b, selend_b;   /* beginning and end of selection in bytes */
        /* if we're a GOP (the new, "goprect" style) borrow the font size
        from the inside to preserve the spacing */

    text_getfont(x->x_text, x->x_glist, &fontwidth, &fontheight, &guifontsize);
    if (x->x_bufsize >= 100)
         tempbuf = (char *)t_getbytes(2 * x->x_bufsize + 1);
    else tempbuf = smallbuf;
    tempbuf[0] = 0;

    if (x->x_text->te_type == T_ATOM)
        rtext_formatatom(x, widthp, heightp, indexp,
            tempbuf, &outchars_b, &selstart_b,  &selend_b,
            fontwidth, fontheight);
    else rtext_formattext(x, widthp, heightp, indexp,
            tempbuf, &outchars_b, &selstart_b, &selend_b,
            fontwidth, fontheight);
    tempbuf[outchars_b]=0;

    if (action && x->x_text->te_width && x->x_text->te_type != T_ATOM)
    {
            /* if our width is specified but the "natural" width is the
            same as the specified width, set specified width to zero
            so future text editing will automatically change width.
            Except atoms whose content changes at runtime. */
        int widthwas = x->x_text->te_width, newwidth = 0, newheight = 0,
            newindex = 0;
        x->x_text->te_width = 0;
        rtext_senditup(x, 0, &newwidth, &newheight, &newindex);
        if (newwidth != *widthp)
            x->x_text->te_width = widthwas;
    }

    if (action && !canvas->gl_havewindow)
        action = 0;

    if (action == SEND_FIRST)
    {
        const char *tags[] = {x->x_tag, rtext_gettype(x)->s_name, "text"};
        int lmargin = LMARGIN, tmargin = TMARGIN;
        if (glist_getzoom(x->x_glist) > 1)
        {
            /* zoom margins */
            lmargin *= glist_getzoom(x->x_glist);
            tmargin *= glist_getzoom(x->x_glist);
        }
            /* we add an extra space to the string just in case the last
            character is an unescaped backslash ('\') which would have confused
            tcl/tk by escaping the close brace otherwise.  The GUI code
            drops the last character in the string. */
        pdgui_vmess("pdtk_text_new", "c S ii s i r",
            canvas,
            3, tags,
            text_xpix(x->x_text, x->x_glist) + lmargin, text_ypix(x->x_text, x->x_glist) + tmargin,
            tempbuf,
            guifontsize,
            (glist_isselected(x->x_glist, &x->x_text->te_g)? "blue" : "black"));
    }
    else if (action == SEND_UPDATE)
    {
        pdgui_vmess("pdtk_text_set", "cs s",
                  canvas, x->x_tag,
                  tempbuf);
        if (*widthp != x->x_drawnwidth || *heightp != x->x_drawnheight)
            text_drawborder(x->x_text, x->x_glist, x->x_tag,
                *widthp, *heightp, 0);
        if (x->x_active)
        {
            if (selend_b > selstart_b)
            {
                pdgui_vmess(0, "crr si",
                    canvas, "select", "from",
                    x->x_tag, u8_charnum(x->x_buf, selstart_b));
                pdgui_vmess(0, "crr si",
                    canvas, "select", "to",
                    x->x_tag, u8_charnum(x->x_buf, selend_b) - 1);
                pdgui_vmess(0, "crs", canvas, "focus", "");
            }
            else
            {
                pdgui_vmess(0, "crr", canvas, "select", "clear");
                pdgui_vmess(0, "cr si", canvas, "icursor", x->x_tag, u8_charnum(x->x_buf, selstart_b));
                pdgui_vmess("focus", "c", canvas);
                pdgui_vmess(0, "crs", canvas, "focus", x->x_tag);
            }
        }
    }
    x->x_drawnwidth = *widthp;
    x->x_drawnheight = *heightp;

    if (tempbuf != smallbuf)
        t_freebytes(tempbuf, 2 * x->x_bufsize + 1);
}